

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,int a,int b)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->n = a;
  this->m = b;
  uVar5 = 0;
  uVar4 = (ulong)(uint)a << 3;
  if (a < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar6 = (ulong)(uint)a;
  if (a < 1) {
    uVar6 = uVar5;
  }
  ppdVar1 = (double **)operator_new__(uVar4);
  this->M = ppdVar1;
  uVar4 = (ulong)(uint)b << 3;
  if (b < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2 = (double *)operator_new__(uVar4);
    this->M[uVar5] = pdVar2;
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)b;
  if (b < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    ppdVar1 = this->M;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      ppdVar1[uVar5][uVar3] = 0.0;
    }
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }